

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

Tagger * MeCab::createTagger(int argc,char **argv)

{
  uint uVar1;
  int in_ESI;
  uint in_EDI;
  TaggerImpl *tagger;
  TaggerImpl *in_stack_ffffffffffffffd0;
  TaggerImpl *local_8;
  
  local_8 = (TaggerImpl *)operator_new(0x60);
  anon_unknown_0::TaggerImpl::TaggerImpl(in_stack_ffffffffffffffd0);
  uVar1 = anon_unknown_0::TaggerImpl::open(local_8,(char *)(ulong)in_EDI,in_ESI);
  if ((uVar1 & 1) == 0) {
    (*(local_8->super_Tagger)._vptr_Tagger[0x1b])();
    setGlobalError((char *)0x19f230);
    if (local_8 != (TaggerImpl *)0x0) {
      (*(local_8->super_Tagger)._vptr_Tagger[0x1d])();
    }
    local_8 = (TaggerImpl *)0x0;
  }
  return &local_8->super_Tagger;
}

Assistant:

Tagger *createTagger(int argc, char **argv) {
  TaggerImpl *tagger = new TaggerImpl();
  if (!tagger->open(argc, argv)) {
    setGlobalError(tagger->what());
    delete tagger;
    return 0;
  }
  return tagger;
}